

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall
Assimp::PretransformVertices::GetVFormatList
          (PretransformVertices *this,aiScene *pcScene,uint iMat,
          list<unsigned_int,_std::allocator<unsigned_int>_> *aiOut)

{
  size_t *psVar1;
  aiMesh *pcMesh;
  uint uVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  aiBone **ppaVar5;
  
  if (pcScene->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      pcMesh = pcScene->mMeshes[uVar4];
      if (pcMesh->mMaterialIndex == iMat) {
        ppaVar5 = pcMesh->mBones;
        if (ppaVar5 == (aiBone **)0x0) {
          uVar2 = GetMeshVFormatUnique(pcMesh);
          ppaVar5 = (aiBone **)(ulong)uVar2;
          pcMesh->mBones = (aiBone **)(ulong)uVar2;
        }
        p_Var3 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var3[1]._M_next = (int)ppaVar5;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(aiOut->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pcScene->mNumMeshes);
  }
  return;
}

Assistant:

void PretransformVertices::GetVFormatList( aiScene* pcScene, unsigned int iMat,
    std::list<unsigned int>& aiOut)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ i ];
        if (iMat == pcMesh->mMaterialIndex) {
            aiOut.push_back(GetMeshVFormat(pcMesh));
        }
    }
}